

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void vkt::Draw::createDrawTests(TestCaseGroup *testGroup)

{
  TestContext *testCtx;
  TestNode *node;
  int *piVar1;
  int iVar2;
  allocator<char> local_71;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = 0;
  piVar1 = &DAT_00b63cec;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,(char *)((long)&DAT_00b63cec + (long)*piVar1),&local_71);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Group for testing a specific draw command.","");
    testCtx = (testGroup->super_TestNode).m_testCtx;
    node = (TestNode *)operator_new(0x80);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,testCtx,(char *)local_50[0],(char *)local_70[0]);
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d61360;
    node[1]._vptr_TestNode = (_func_int **)createTopologyGroups;
    *(int *)&node[1].m_testCtx = iVar2;
    tcu::TestNode::addChild(&testGroup->super_TestNode,node);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    iVar2 = iVar2 + 1;
    piVar1 = piVar1 + 1;
  } while (iVar2 != 4);
  return;
}

Assistant:

void createDrawTests (tcu::TestCaseGroup* testGroup)
{
	for (deUint32 idx = 0; idx < DRAW_COMMAND_TYPE_DRAW_LAST; ++idx)
	{
		const DrawCommandType	command	= DrawCommandType(idx);
		addTestGroup(testGroup, getDrawCommandTypeName(command), "Group for testing a specific draw command.", createTopologyGroups, command);
	}
}